

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

bool_t botpOCRAStart(void *state,char *suite,octet *key,size_t key_len)

{
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  void *buf;
  void *state_00;
  char *pcVar6;
  char *in_RSI;
  long *in_RDI;
  char *suite_save;
  botp_ocra_st *st;
  undefined8 in_stack_ffffffffffffff98;
  octet c;
  void *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  long *state_01;
  char *local_18;
  bool_t local_4;
  
  c = (octet)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  state_01 = in_RDI;
  botpOCRA_keep();
  memSet(in_stack_ffffffffffffffa0,c,0x15ad5a);
  bVar1 = strStartsWith(in_RSI,"OCRA-1:HOTP-");
  if (bVar1 == 0) {
    local_4 = 0;
  }
  else {
    sVar3 = strLen((char *)0x15ad89);
    bVar1 = strStartsWith(in_RSI + sVar3,"HBELT");
    if (bVar1 == 0) {
      local_4 = 0;
    }
    else {
      sVar4 = strLen((char *)0x15adc2);
      pcVar5 = in_RSI + sVar3 + sVar4;
      pcVar6 = pcVar5 + 1;
      if (*pcVar5 == '-') {
        if ((*pcVar6 < '4') || ('9' < *pcVar6)) {
          local_4 = 0;
        }
        else {
          *in_RDI = (long)(*pcVar6 + -0x30);
          local_18 = pcVar5 + 3;
          if (pcVar5[2] == ':') {
            if (*local_18 == 'C') {
              if (pcVar5[4] != '-') {
                return 0;
              }
              local_18 = pcVar5 + 5;
              in_RDI[3] = 8;
            }
            if (*local_18 == 'Q') {
              iVar2 = (int)local_18[1];
              if (((iVar2 == 0x41) || (iVar2 == 0x48)) || (iVar2 == 0x4e)) {
                pcVar5 = local_18 + 2;
                *(char *)(in_RDI + 0x14) = local_18[1];
                if (((*pcVar5 < '0') || ('9' < *pcVar5)) ||
                   ((local_18[3] < '0' || ('9' < local_18[3])))) {
                  local_4 = 0;
                }
                else {
                  in_RDI[0x15] = (long)(*pcVar5 + -0x30);
                  in_RDI[0x15] = in_RDI[0x15] * 10;
                  in_RDI[0x15] = (long)(local_18[3] + -0x30) + in_RDI[0x15];
                  if (((ulong)in_RDI[0x15] < 4) || (0x40 < (ulong)in_RDI[0x15])) {
                    local_4 = 0;
                  }
                  else {
                    bVar1 = strStartsWith(local_18 + 4,"-P");
                    pcVar5 = local_18 + 4;
                    if (bVar1 != 0) {
                      local_18 = local_18 + 6;
                      bVar1 = strStartsWith(local_18,"HBELT");
                      if (bVar1 == 0) {
                        bVar1 = strStartsWith(local_18,"SHA1");
                        if (bVar1 == 0) {
                          bVar1 = strStartsWith(local_18,"SHA256");
                          if (bVar1 == 0) {
                            bVar1 = strStartsWith(local_18,"SHA512");
                            if (bVar1 == 0) {
                              return 0;
                            }
                            sVar3 = strLen((char *)0x15b102);
                            in_RDI[0x1e] = 0x40;
                          }
                          else {
                            sVar3 = strLen((char *)0x15b0c4);
                            in_RDI[0x1e] = 0x20;
                          }
                        }
                        else {
                          sVar3 = strLen((char *)0x15b083);
                          in_RDI[0x1e] = 0x14;
                        }
                      }
                      else {
                        sVar3 = strLen((char *)0x15b042);
                        in_RDI[0x1e] = 0x20;
                      }
                      local_18 = local_18 + sVar3;
                      pcVar5 = local_18;
                    }
                    local_18 = pcVar5;
                    bVar1 = strStartsWith(local_18,"-S");
                    if (bVar1 != 0) {
                      pcVar5 = local_18 + 2;
                      if (((((*pcVar5 < '0') || ('9' < *pcVar5)) || (local_18[3] < '0')) ||
                          (('9' < local_18[3] || (local_18[4] < '0')))) || ('9' < local_18[4])) {
                        return 0;
                      }
                      in_RDI[0x5f] = (long)(*pcVar5 + -0x30);
                      in_RDI[0x5f] = in_RDI[0x5f] * 10;
                      in_RDI[0x5f] = (long)(local_18[3] + -0x30) + in_RDI[0x5f];
                      in_RDI[0x5f] = in_RDI[0x5f] * 10;
                      in_RDI[0x5f] = (long)(local_18[4] + -0x30) + in_RDI[0x5f];
                      if (0x200 < (ulong)in_RDI[0x5f]) {
                        return 0;
                      }
                      local_18 = local_18 + 5;
                    }
                    bVar1 = strStartsWith(local_18,"-T");
                    if (bVar1 != 0) {
                      pcVar5 = local_18 + 2;
                      if ((*pcVar5 < '1') || ('9' < *pcVar5)) {
                        return 0;
                      }
                      pcVar6 = local_18 + 3;
                      in_RDI[0x61] = (long)(*pcVar5 + -0x30);
                      if (('/' < *pcVar6) && (*pcVar6 < ':')) {
                        in_RDI[0x61] = in_RDI[0x61] * 10;
                        in_RDI[0x61] = (long)(*pcVar6 + -0x30) + in_RDI[0x61];
                        pcVar6 = local_18 + 4;
                      }
                      local_18 = pcVar6;
                      pcVar5 = local_18 + 1;
                      in_stack_ffffffffffffffb8 = (int)*local_18;
                      local_18 = pcVar5;
                      if (in_stack_ffffffffffffffb8 == 0x48) {
                        if (0x30 < in_RDI[0x61]) {
                          return 0;
                        }
                        in_RDI[0x61] = in_RDI[0x61] * 0xe10;
                      }
                      else if (in_stack_ffffffffffffffb8 == 0x4d) {
                        if (0x3b < in_RDI[0x61]) {
                          return 0;
                        }
                        in_RDI[0x61] = in_RDI[0x61] * 0x3c;
                      }
                      else {
                        if (in_stack_ffffffffffffffb8 != 0x53) {
                          return 0;
                        }
                        if (0x3b < in_RDI[0x61]) {
                          return 0;
                        }
                      }
                    }
                    if (*local_18 == '\0') {
                      beltHMAC_keep();
                      beltHMACStart(state_01,(octet *)CONCAT44(iVar2,in_stack_ffffffffffffffb8),
                                    in_stack_ffffffffffffffb0);
                      sVar3 = strLen((char *)0x15b45d);
                      buf = (void *)(sVar3 + 1);
                      state_00 = (void *)((long)in_RDI + 0x33a);
                      beltHMAC_keep();
                      beltHMACStepA(buf,(size_t)in_RSI,state_00);
                      local_4 = 1;
                    }
                    else {
                      local_4 = 0;
                    }
                  }
                }
              }
              else {
                local_4 = 0;
              }
            }
            else {
              local_4 = 0;
            }
          }
          else {
            local_4 = 0;
          }
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

bool_t botpOCRAStart(void* state, const char* suite, const octet key[], 
	size_t key_len)
{
	botp_ocra_st* st = (botp_ocra_st*)state;
	const char* suite_save = suite;
	// pre
	ASSERT(strIsValid(suite));
	ASSERT(memIsDisjoint2(suite, strLen(suite) + 1, state, botpOCRA_keep()));
	ASSERT(memIsDisjoint2(key, key_len, state, botpOCRA_keep()));
	// подготовить state
	memSetZero(st, botpOCRA_keep());
	// разбор suite: префикс
	if (!strStartsWith(suite, ocra_prefix))
		return FALSE;
	suite += strLen(ocra_prefix);
	if (!strStartsWith(suite, ocra_hbelt))
		return FALSE;
	suite += strLen(ocra_hbelt);
	if (*suite++ != '-')
		return FALSE;
	// разбор suite: digit
	if (*suite < '4' || *suite > '9')
		return FALSE;
	st->digit = (size_t)(*suite++ - '0');
	// разбор suite: DataInput
	if (*suite++ != ':')
		return FALSE;
	// разбор suite: ctr
	if (*suite == 'C')
	{
		if (*++suite != '-')
			return FALSE;
		++suite;
		st->ctr_len = 8;
	}
	// разбор suite: q
	if (*suite++ != 'Q')
		return FALSE;
	switch (*suite)
	{
	case 'A':
	case 'N':
	case 'H':
		st->q_type = *suite++;
		break;
	default:
		return FALSE;
	}
	if (suite[0] < '0' || suite[0] > '9' || suite[1] < '0' || suite[1] > '9')
		return FALSE;
	st->q_max = (size_t)(suite[0] - '0');
	st->q_max *= 10, st->q_max += (size_t)(suite[1] - '0');
	if (st->q_max < 4 || st->q_max > 64)
		return FALSE;
	suite += 2;
	// разбор suite: p
	if (strStartsWith(suite, "-P"))
	{
		suite += 2;
		if (strStartsWith(suite, ocra_hbelt))
		{
			suite += strLen(ocra_hbelt);
			st->p_len = 32;
		}
		else if (strStartsWith(suite, ocra_sha1))
		{
			suite += strLen(ocra_sha1);
			st->p_len = 20;
		}
		else if (strStartsWith(suite, ocra_sha256))
		{
			suite += strLen(ocra_sha256);
			st->p_len = 32;
		}
		else if (strStartsWith(suite, ocra_sha512))
		{
			suite += strLen(ocra_sha512);
			st->p_len = 64;
		}
		else
			return FALSE;
	}
	// разбор suite: s
	if (strStartsWith(suite, "-S"))
	{
		suite += 2;
		if (suite[0] < '0' || suite[0] > '9' || 
			suite[1] < '0' || suite[1] > '9' ||
			suite[2] < '0' || suite[2] > '9')
			return FALSE;
		st->s_len = (size_t)(suite[0] - '0');
		st->s_len *= 10, st->s_len += (size_t)(suite[1] - '0');
		st->s_len *= 10, st->s_len += (size_t)(suite[2] - '0');
		if (st->s_len > 512)
			return FALSE;
		suite += 3;
	}
	// разбор suite: t
	if (strStartsWith(suite, "-T"))
	{
		suite += 2;
		if (*suite < '1' || *suite > '9')
			return FALSE;
		st->ts = (size_t)(*suite++ - '0');
		if (*suite >= '0' && *suite <= '9')
			st->ts *= 10, st->ts += (size_t)(*suite++ - '0');
		switch (*suite++)
		{
		case 'S':
			if (st->ts > 59)
				return FALSE;
			break;
		case 'M':
			if (st->ts > 59)
				return FALSE;
			st->ts *= 60;
			break;
		case 'H':
			if (st->ts > 48)
				return FALSE;
			st->ts *= 3600;
			break;
		default:
			return FALSE;
		}
	}
	// разбор suite: окончание
	if (*suite)
		return FALSE;
	// запуск HMAC 
	beltHMACStart(st->stack + beltHMAC_keep(), key, key_len);
	beltHMACStepA(suite_save, strLen(suite_save) + 1,
		st->stack + beltHMAC_keep());
	return TRUE;
}